

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall QMdiSubWindowPrivate::enterRubberBandMode(QMdiSubWindowPrivate *this)

{
  QWidget *this_00;
  bool bVar1;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this_01;
  long in_FS_OFFSET;
  QAnyStringView QVar2;
  QRect local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  bVar1 = QWidget::isMaximized(this_00);
  if (!bVar1) {
    if (this->rubberBand == (QRubberBand *)0x0) {
      this_01.m_data = operator_new(0x28);
      QRubberBand::QRubberBand
                ((QRubberBand *)this_01.m_data,Rectangle,
                 *(QWidget **)(*(long *)&this_00->field_0x8 + 0x10));
      this->rubberBand = (QRubberBand *)this_01;
      QVar2.m_size = (size_t)"qt_rubberband";
      QVar2.field_0.m_data = this_01.m_data;
      QObject::setObjectName(QVar2);
    }
    local_30.x1.m_i = 0;
    local_30.y1.m_i = 0;
    local_30._0_8_ = QWidget::mapToParent(this_00,(QPoint *)&local_30);
    local_30.x2.m_i = ((this->oldGeometry).x2.m_i + local_30.x1.m_i) - (this->oldGeometry).x1.m_i;
    local_30.y2.m_i = ((this->oldGeometry).y2.m_i + local_30.y1.m_i) - (this->oldGeometry).y1.m_i;
    QRubberBand::setGeometry(this->rubberBand,&local_30);
    QWidget::show(&this->rubberBand->super_QWidget);
    this->isInRubberBandMode = true;
    QWidget::grabMouse(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::enterRubberBandMode()
{
    Q_Q(QMdiSubWindow);
    if (q->isMaximized())
        return;
    Q_ASSERT(oldGeometry.isValid());
    Q_ASSERT(parent);
    if (!rubberBand) {
        rubberBand = new QRubberBand(QRubberBand::Rectangle, q->parentWidget());
        // For accessibility to identify this special widget.
        rubberBand->setObjectName("qt_rubberband"_L1);
    }
    QPoint rubberBandPos = q->mapToParent(QPoint(0, 0));
    rubberBand->setGeometry(rubberBandPos.x(), rubberBandPos.y(),
                            oldGeometry.width(), oldGeometry.height());
    rubberBand->show();
    isInRubberBandMode = true;
    q->grabMouse();
}